

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void ssh_ppl_setup_queues(PacketProtocolLayer *ppl,PktInQueue *inq,PktOutQueue *outq)

{
  PktIn *pPVar1;
  
  ppl->in_pq = inq;
  ppl->out_pq = outq;
  (inq->pqb).ic = &ppl->ic_process_queue;
  (ppl->ic_process_queue).fn = ssh_ppl_ic_process_queue_callback;
  (ppl->ic_process_queue).ctx = ppl;
  pPVar1 = (*inq->after)(&inq->pqb,(PacketQueueNode *)inq,false);
  if (pPVar1 != (PktIn *)0x0) {
    queue_idempotent_callback(&ppl->ic_process_queue);
    return;
  }
  return;
}

Assistant:

void ssh_ppl_setup_queues(PacketProtocolLayer *ppl,
                          PktInQueue *inq, PktOutQueue *outq)
{
    ppl->in_pq = inq;
    ppl->out_pq = outq;
    ppl->in_pq->pqb.ic = &ppl->ic_process_queue;
    ppl->ic_process_queue.fn = ssh_ppl_ic_process_queue_callback;
    ppl->ic_process_queue.ctx = ppl;

    /* If there's already something on the input queue, it will want
     * handling immediately. */
    if (pq_peek(ppl->in_pq))
        queue_idempotent_callback(&ppl->ic_process_queue);
}